

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O3

void __thiscall Gym_Emu::parse_frame(Gym_Emu *this)

{
  int iVar1;
  uint data;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  bool bVar6;
  
  pbVar2 = this->pos;
  if ((this->loop_remain != 0) &&
     (iVar1 = this->loop_remain + -1, this->loop_remain = iVar1, iVar1 == 0)) {
    this->loop_begin = pbVar2;
  }
  pbVar3 = pbVar2 + 1;
  bVar4 = *pbVar2;
  if (bVar4 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    do {
      data = (uint)pbVar2[1];
      if (bVar4 == 3) {
        pbVar5 = pbVar2 + 2;
        Sms_Apu::write_data(&this->apu,0,data);
LAB_006e05bc:
        bVar4 = *pbVar5;
      }
      else {
        if (bVar4 == 2) {
          pbVar5 = pbVar2 + 3;
          Ym2612_Emu::write1(&this->fm,data,(uint)pbVar2[2]);
          goto LAB_006e05bc;
        }
        bVar6 = bVar4 == 1;
        pbVar5 = pbVar3;
        bVar4 = pbVar2[1];
        if (bVar6) {
          bVar4 = pbVar2[2];
          pbVar5 = pbVar2 + 3;
          if (data == 0x2a) {
            if (iVar1 < 0x400) {
              this->dac_buf[iVar1] = bVar4;
              iVar1 = iVar1 + (uint)this->dac_enabled;
            }
          }
          else {
            if (data == 0x2b) {
              this->dac_enabled = (bool)(bVar4 >> 7);
            }
            Ym2612_Emu::write0(&this->fm,data,(uint)bVar4);
          }
          goto LAB_006e05bc;
        }
      }
      pbVar3 = pbVar5 + 1;
      pbVar2 = pbVar5;
    } while (bVar4 != 0);
  }
  pbVar2 = pbVar3;
  if ((this->data_end <= pbVar3) && (pbVar2 = this->loop_begin, this->loop_begin == (byte *)0x0)) {
    (this->super_Music_Emu).emu_track_ended_ = true;
    pbVar2 = pbVar3;
  }
  this->pos = pbVar2;
  if ((iVar1 != 0) && (this->dac_muted == false)) {
    run_dac(this,iVar1);
  }
  this->prev_dac_count = iVar1;
  return;
}

Assistant:

void Gym_Emu::parse_frame()
{
	int dac_count = 0;
	const byte* pos = this->pos;
	
	if ( loop_remain && !--loop_remain )
		loop_begin = pos; // find loop on first time through sequence
	
	int cmd;
	while ( (cmd = *pos++) != 0 )
	{
		int data = *pos++;
		if ( cmd == 1 )
		{
			int data2 = *pos++;
			if ( data != 0x2A )
			{
				if ( data == 0x2B )
					dac_enabled = (data2 & 0x80) != 0;
				
				fm.write0( data, data2 );
			}
			else if ( dac_count < (int) sizeof dac_buf )
			{
				dac_buf [dac_count] = data2;
				dac_count += dac_enabled;
			}
		}
		else if ( cmd == 2 )
		{
			fm.write1( data, *pos++ );
		}
		else if ( cmd == 3 )
		{
			apu.write_data( 0, data );
		}
		else
		{
			// to do: many GYM streams are full of errors, and error count should
			// reflect cases where music is really having problems
			//log_error(); 
			--pos; // put data back
		}
	}
	
	// loop
	if ( pos >= data_end )
	{
		check( pos == data_end );
		
		if ( loop_begin )
			pos = loop_begin;
		else
			set_track_ended();
	}
	this->pos = pos;
	
	// dac
	if ( dac_count && !dac_muted )
		run_dac( dac_count );
	prev_dac_count = dac_count;
}